

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_counter.cc
# Opt level: O1

void __thiscall absl::lts_20240722::BlockingCounter::Wait(BlockingCounter *this)

{
  undefined8 extraout_RAX;
  Condition local_30;
  
  Mutex::Lock(&this->lock_);
  if (this->num_waiting_ == 0) {
    this->num_waiting_ = 1;
    Condition::Condition(&local_30,anon_unknown_16::IsDone,&this->done_);
    Mutex::AwaitCommon(&this->lock_,&local_30,(KernelTimeout)0xffffffffffffffff);
    Mutex::Unlock(&this->lock_);
    return;
  }
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"blocking_counter.cc",0x37,"Check %s failed: %s","num_waiting_ == 0",
             "multiple threads called Wait()");
  Wait();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

void BlockingCounter::Wait() {
  MutexLock l(&this->lock_);

  // only one thread may call Wait(). To support more than one thread,
  // implement a counter num_to_exit, like in the Barrier class.
  ABSL_RAW_CHECK(num_waiting_ == 0, "multiple threads called Wait()");
  num_waiting_++;

  this->lock_.Await(Condition(IsDone, &this->done_));

  // At this point, we know that all threads executing DecrementCount
  // will not touch this object again.
  // Therefore, the thread calling this method is free to delete the object
  // after we return from this method.
}